

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O1

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::cropImage<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *__return_storage_ptr__,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long x,long y,long w,
          long h)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uchar uVar6;
  size_t __n;
  
  __n = 0;
  if (0 < w) {
    __n = w;
  }
  lVar3 = 0;
  if (0 < h) {
    lVar3 = h;
  }
  iVar2 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (uchar *)0x0;
  __return_storage_ptr__->row = (uchar **)0x0;
  __return_storage_ptr__->img = (uchar ***)0x0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (__return_storage_ptr__,__n,lVar3,(long)iVar2);
  if ((((y | x) < 0) || (image->width < (long)(__n + x))) || (image->height < lVar3 + y)) {
    if (0 < image->depth) {
      lVar3 = 0;
      do {
        if (0 < h) {
          lVar4 = 0;
          do {
            if (0 < w) {
              lVar1 = lVar4 + y;
              lVar5 = 0;
              do {
                uVar6 = 0xff;
                if (((-1 < x + lVar5) && (lVar3 < image->depth)) &&
                   ((-1 < lVar1 && ((x + lVar5 < image->width && (lVar1 < image->height)))))) {
                  uVar6 = image->img[lVar3][lVar1][lVar5 + x];
                }
                __return_storage_ptr__->img[lVar3][lVar4][lVar5] = uVar6;
                lVar5 = lVar5 + 1;
              } while (w != lVar5);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != h);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < image->depth);
    }
  }
  else if (0 < image->depth) {
    lVar3 = 0;
    do {
      if (0 < h) {
        lVar4 = 0;
        do {
          memcpy(__return_storage_ptr__->img[lVar3][lVar4],image->img[lVar3][y + lVar4] + x,__n);
          lVar4 = lVar4 + 1;
        } while (h != lVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < image->depth);
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> cropImage(const Image<T> &image, long x, long y, long w, long h)
{
  w=std::max(0l, w);
  h=std::max(0l, h);

  Image<T> ret(w, h, image.getDepth());

  if (x >= 0 && y >= 0 && x+w <= image.getWidth() && y+h <= image.getHeight())
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        memcpy(ret.getPtr(0, k, d), image.getPtr(x, y+k, d), w*sizeof(T));
      }
    }
  }
  else
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        for (long i=0; i<w; i++)
          ret.set(i, k, d,
                  static_cast<typename Image<T>::store_t>(image.getBoundsInv(x+i, y+k, d)));
      }
    }
  }

  return ret;
}